

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  cmTarget *this_00;
  cmake *propertyValue;
  undefined1 local_108 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d8;
  undefined1 local_a8 [16];
  const_iterator local_98;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50;
  byte local_19;
  undefined1 auStack_18 [7];
  bool before_local;
  string *src_local;
  cmGeneratorTarget *this_local;
  
  this_00 = this->Target;
  local_19 = before;
  _auStack_18 = src;
  src_local = (string *)this;
  std::__cxx11::string::string((string *)(local_80 + 0x10),(string *)src);
  cmMakefile::GetBacktrace((cmMakefile *)local_80);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_80 + 0x30),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_80 + 0x10),
             (cmListFileBacktrace *)local_80);
  cmTarget::InsertInclude
            (this_00,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_80 + 0x30),(bool)(local_19 & 1));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_80 + 0x30));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 0x10));
  if ((local_19 & 1) == 0) {
    local_a8._8_8_ =
         std::
         vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
         ::end(&this->IncludeDirectoriesEntries);
  }
  else {
    local_a8._8_8_ =
         std::
         vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
         ::begin(&this->IncludeDirectoriesEntries);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>const*,std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>,std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>>>>
  ::
  __normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>*>
            ((__normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>const*,std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>,std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>>>>
              *)&local_98,
             (__normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>_>
              *)(local_a8 + 8));
  propertyValue = cmMakefile::GetCMakeInstance(this->Makefile);
  std::__cxx11::string::string((string *)(local_108 + 0x10),(string *)_auStack_18);
  cmMakefile::GetBacktrace((cmMakefile *)local_108);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_108 + 0x30),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 0x10)
             ,(cmListFileBacktrace *)local_108);
  CreateTargetPropertyEntry
            ((cmake *)local_a8,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )propertyValue,(bool)((char)local_108 + '0'));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::insert(&this->IncludeDirectoriesEntries,local_98,(value_type *)local_a8);
  std::
  unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  ::~unique_ptr((unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                 *)local_a8);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_108 + 0x30));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_108);
  std::__cxx11::string::~string((string *)(local_108 + 0x10));
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(
    BT<std::string>(src, this->Makefile->GetBacktrace()), before);
  this->IncludeDirectoriesEntries.insert(
    before ? this->IncludeDirectoriesEntries.begin()
           : this->IncludeDirectoriesEntries.end(),
    CreateTargetPropertyEntry(
      *this->Makefile->GetCMakeInstance(),
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
}